

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_jump_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  gtoken_s token_00;
  gtoken_t gVar1;
  gnode_t *pgVar2;
  gnode_t *local_60;
  gnode_t *local_50;
  gnode_t *expr;
  gtoken_s token;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  token.value._4_4_ = gravity_lexer_next(lexer_00);
  gravity_lexer_token((gtoken_s *)&expr,lexer_00);
  if (((token.value._4_4_ != TOK_KEY_BREAK) && (token.value._4_4_ != TOK_KEY_CONTINUE)) &&
     (token.value._4_4_ != TOK_KEY_RETURN)) {
    __assert_fail("(type == TOK_KEY_BREAK) || (type == TOK_KEY_CONTINUE) || (type == TOK_KEY_RETURN)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x8f7,"gnode_t *parse_jump_statement(gravity_parser_t *)");
  }
  local_50 = (gnode_t *)0x0;
  if (token.value._4_4_ == TOK_KEY_RETURN) {
    gVar1 = gravity_lexer_peek(lexer_00);
    if (gVar1 != TOK_OP_SEMICOLON) {
      gVar1 = gravity_lexer_peek(lexer_00);
      if (gVar1 != TOK_OP_CLOSED_CURLYBRACE) {
        local_50 = parse_expression(parser);
      }
    }
  }
  parse_semicolon(parser);
  if (parser->declarations->n == 0) {
    local_60 = (gnode_t *)0x0;
  }
  else {
    local_60 = parser->declarations->p[parser->declarations->n - 1];
  }
  token_00.colno = token.type;
  token_00.position = token.lineno;
  token_00._0_8_ = expr;
  token_00.bytes = token.colno;
  token_00.length = token.position;
  token_00.fileid = token.bytes;
  token_00.builtin = token.length;
  token_00.value = (char *)token._24_8_;
  pgVar2 = gnode_jump_stat_create(token_00,local_50,local_60);
  return pgVar2;
}

Assistant:

static gnode_t *parse_jump_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_jump_statement");

    // 'break' ';'
    // 'continue' ';'
    // 'return' expression? ';'

    DECLARE_LEXER;
    gtoken_t type = gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    assert((type == TOK_KEY_BREAK) || (type == TOK_KEY_CONTINUE) || (type == TOK_KEY_RETURN));

    gnode_t *expr = NULL;
    if ((type == TOK_KEY_RETURN) && (gravity_lexer_peek(lexer) != TOK_OP_SEMICOLON) && (gravity_lexer_peek(lexer) != TOK_OP_CLOSED_CURLYBRACE)) {
        expr = parse_expression(parser);
    }

    parse_semicolon(parser);
    return gnode_jump_stat_create(token, expr, LAST_DECLARATION());
}